

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_tests.cpp
# Opt level: O2

void TestFixture::SetUpTestCase(void)

{
  int *in_R9;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  local_190.super_Message.m_stream.super_iu_stringstream._0_4_ = 0xffffffff;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"-1","x",(char *)&local_190,&x,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/fixture_tests.cpp"
               ,0x35,iutest_ar.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
    std::__cxx11::string::~string((string *)&local_1c0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    std::__cxx11::string::~string((string *)&iutest_ar);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    x = 0;
  }
  return;
}

Assistant:

static void SetUpTestCase(void)
    {
        IUTEST_ASSERT_EQ(-1, x);
        x = 0;
    }